

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_8.c
# Opt level: O2

parasail_result_t *
parasail_nw_rowcol_scan_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i *palVar1;
  longlong *plVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  __m256i alVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  longlong lVar23;
  longlong lVar24;
  char cVar25;
  uint uVar26;
  parasail_result_t *ppVar27;
  __m256i *ptr;
  int8_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  byte bVar28;
  int iVar29;
  char *pcVar30;
  int iVar31;
  int32_t segNum;
  ulong size;
  long lVar32;
  uint uVar33;
  uint uVar34;
  char *__format;
  int8_t iVar35;
  long lVar36;
  ulong uVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  bool bVar42;
  undefined1 uVar43;
  char cVar44;
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  __m256i_8_t e;
  __m256i_8_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar46 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar30 = "profile";
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar30 = "profile->profile8.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar30 = "profile->matrix";
      }
      else {
        uVar34 = profile->s1Len;
        if ((int)uVar34 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar30 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar30 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar30 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar30 = "open";
        }
        else {
          if (-1 < gap) {
            uVar26 = uVar34 - 1;
            size = (ulong)uVar34 + 0x1f >> 5;
            iVar29 = ppVar4->min;
            iVar41 = -open;
            uVar33 = (uint)(byte)-(char)iVar29;
            if (iVar29 != iVar41 && SBORROW4(iVar29,iVar41) == iVar29 + open < 0) {
              uVar33 = open;
            }
            cVar25 = '~' - (char)ppVar4->max;
            ppVar27 = parasail_result_new_rowcol1((uint)((ulong)uVar34 + 0x1f) & 0x7fffffe0,s2Len);
            if (ppVar27 != (parasail_result_t *)0x0) {
              ppVar27->flag = ppVar27->flag | 0x20140401;
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              if (ptr_03 != (__m256i *)0x0 &&
                  ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                  (ptr_00 != (int8_t *)0x0 && ptr != (__m256i *)0x0))) {
                iVar29 = s2Len + -1;
                iVar31 = 0x1f - (int)(uVar26 / size);
                uVar43 = (undefined1)open;
                auVar51[1] = uVar43;
                auVar51[0] = uVar43;
                auVar51[2] = uVar43;
                auVar51[3] = uVar43;
                auVar51[4] = uVar43;
                auVar51[5] = uVar43;
                auVar51[6] = uVar43;
                auVar51[7] = uVar43;
                auVar51[8] = uVar43;
                auVar51[9] = uVar43;
                auVar51[10] = uVar43;
                auVar51[0xb] = uVar43;
                auVar51[0xc] = uVar43;
                auVar51[0xd] = uVar43;
                auVar51[0xe] = uVar43;
                auVar51[0xf] = uVar43;
                auVar51[0x10] = uVar43;
                auVar51[0x11] = uVar43;
                auVar51[0x12] = uVar43;
                auVar51[0x13] = uVar43;
                auVar51[0x14] = uVar43;
                auVar51[0x15] = uVar43;
                auVar51[0x16] = uVar43;
                auVar51[0x17] = uVar43;
                auVar51[0x18] = uVar43;
                auVar51[0x19] = uVar43;
                auVar51[0x1a] = uVar43;
                auVar51[0x1b] = uVar43;
                auVar51[0x1c] = uVar43;
                auVar51[0x1d] = uVar43;
                auVar51[0x1e] = uVar43;
                auVar51[0x1f] = uVar43;
                cVar44 = (char)gap;
                auVar52[1] = cVar44;
                auVar52[0] = cVar44;
                auVar52[2] = cVar44;
                auVar52[3] = cVar44;
                auVar52[4] = cVar44;
                auVar52[5] = cVar44;
                auVar52[6] = cVar44;
                auVar52[7] = cVar44;
                auVar52[8] = cVar44;
                auVar52[9] = cVar44;
                auVar52[10] = cVar44;
                auVar52[0xb] = cVar44;
                auVar52[0xc] = cVar44;
                auVar52[0xd] = cVar44;
                auVar52[0xe] = cVar44;
                auVar52[0xf] = cVar44;
                auVar52[0x10] = cVar44;
                auVar52[0x11] = cVar44;
                auVar52[0x12] = cVar44;
                auVar52[0x13] = cVar44;
                auVar52[0x14] = cVar44;
                auVar52[0x15] = cVar44;
                auVar52[0x16] = cVar44;
                auVar52[0x17] = cVar44;
                auVar52[0x18] = cVar44;
                auVar52[0x19] = cVar44;
                auVar52[0x1a] = cVar44;
                auVar52[0x1b] = cVar44;
                auVar52[0x1c] = cVar44;
                auVar52[0x1d] = cVar44;
                auVar52[0x1e] = cVar44;
                auVar52[0x1f] = cVar44;
                bVar28 = (char)uVar33 + 0x81;
                auVar45[1] = bVar28;
                auVar45[0] = bVar28;
                auVar45[2] = bVar28;
                auVar45[3] = bVar28;
                auVar45[4] = bVar28;
                auVar45[5] = bVar28;
                auVar45[6] = bVar28;
                auVar45[7] = bVar28;
                auVar45[8] = bVar28;
                auVar45[9] = bVar28;
                auVar45[10] = bVar28;
                auVar45[0xb] = bVar28;
                auVar45[0xc] = bVar28;
                auVar45[0xd] = bVar28;
                auVar45[0xe] = bVar28;
                auVar45[0xf] = bVar28;
                auVar46[0x10] = bVar28;
                auVar46._0_16_ = auVar45;
                auVar46[0x11] = bVar28;
                auVar46[0x12] = bVar28;
                auVar46[0x13] = bVar28;
                auVar46[0x14] = bVar28;
                auVar46[0x15] = bVar28;
                auVar46[0x16] = bVar28;
                auVar46[0x17] = bVar28;
                auVar46[0x18] = bVar28;
                auVar46[0x19] = bVar28;
                auVar46[0x1a] = bVar28;
                auVar46[0x1b] = bVar28;
                auVar46[0x1c] = bVar28;
                auVar46[0x1d] = bVar28;
                auVar46[0x1e] = bVar28;
                auVar46[0x1f] = bVar28;
                auVar47[1] = cVar25;
                auVar47[0] = cVar25;
                auVar47[2] = cVar25;
                auVar47[3] = cVar25;
                auVar47[4] = cVar25;
                auVar47[5] = cVar25;
                auVar47[6] = cVar25;
                auVar47[7] = cVar25;
                auVar47[8] = cVar25;
                auVar47[9] = cVar25;
                auVar47[10] = cVar25;
                auVar47[0xb] = cVar25;
                auVar47[0xc] = cVar25;
                auVar47[0xd] = cVar25;
                auVar47[0xe] = cVar25;
                auVar47[0xf] = cVar25;
                auVar47[0x10] = cVar25;
                auVar47[0x11] = cVar25;
                auVar47[0x12] = cVar25;
                auVar47[0x13] = cVar25;
                auVar47[0x14] = cVar25;
                auVar47[0x15] = cVar25;
                auVar47[0x16] = cVar25;
                auVar47[0x17] = cVar25;
                auVar47[0x18] = cVar25;
                auVar47[0x19] = cVar25;
                auVar47[0x1a] = cVar25;
                auVar47[0x1b] = cVar25;
                auVar47[0x1c] = cVar25;
                auVar47[0x1d] = cVar25;
                auVar47[0x1e] = cVar25;
                auVar47[0x1f] = cVar25;
                cVar25 = -((char)size * cVar44);
                auVar48[1] = cVar25;
                auVar48[0] = cVar25;
                auVar48[2] = cVar25;
                auVar48[3] = cVar25;
                auVar48[4] = cVar25;
                auVar48[5] = cVar25;
                auVar48[6] = cVar25;
                auVar48[7] = cVar25;
                auVar48[8] = cVar25;
                auVar48[9] = cVar25;
                auVar48[10] = cVar25;
                auVar48[0xb] = cVar25;
                auVar48[0xc] = cVar25;
                auVar48[0xd] = cVar25;
                auVar48[0xe] = cVar25;
                auVar48[0xf] = cVar25;
                auVar48[0x10] = cVar25;
                auVar48[0x11] = cVar25;
                auVar48[0x12] = cVar25;
                auVar48[0x13] = cVar25;
                auVar48[0x14] = cVar25;
                auVar48[0x15] = cVar25;
                auVar48[0x16] = cVar25;
                auVar48[0x17] = cVar25;
                auVar48[0x18] = cVar25;
                auVar48[0x19] = cVar25;
                auVar48[0x1a] = cVar25;
                auVar48[0x1b] = cVar25;
                auVar48[0x1c] = cVar25;
                auVar48[0x1d] = cVar25;
                auVar48[0x1e] = cVar25;
                auVar48[0x1f] = cVar25;
                auVar48 = vpand_avx2(auVar48,_DAT_008a59c0);
                auVar48 = vpaddsb_avx2(ZEXT132(bVar28),auVar48);
                lVar36 = (long)iVar41;
                for (uVar37 = 0; uVar37 != size; uVar37 = uVar37 + 1) {
                  lVar39 = lVar36;
                  for (lVar32 = 0; lVar32 != 0x20; lVar32 = lVar32 + 1) {
                    uVar43 = 0x80;
                    if (-0x80 < lVar39) {
                      uVar43 = (undefined1)lVar39;
                    }
                    lVar40 = lVar39 - (ulong)(uint)open;
                    if ((long)(lVar39 - (ulong)(uint)open) < -0x7f) {
                      lVar40 = -0x80;
                    }
                    *(undefined1 *)((long)&local_80 + lVar32) = uVar43;
                    *(char *)((long)&local_a0 + lVar32) = (char)lVar40;
                    lVar39 = lVar39 - size * (uint)gap;
                  }
                  palVar1 = ptr_02 + uVar37;
                  (*palVar1)[0] = local_80;
                  (*palVar1)[1] = lStack_78;
                  (*palVar1)[2] = lStack_70;
                  (*palVar1)[3] = lStack_68;
                  palVar1 = ptr + uVar37;
                  (*palVar1)[0] = local_a0;
                  (*palVar1)[1] = lStack_98;
                  (*palVar1)[2] = lStack_90;
                  (*palVar1)[3] = lStack_88;
                  lVar36 = lVar36 - (ulong)(uint)gap;
                }
                *ptr_00 = '\0';
                for (uVar37 = 1; s2Len + 1 != uVar37; uVar37 = uVar37 + 1) {
                  iVar35 = -0x80;
                  if (-0x80 < iVar41) {
                    iVar35 = (int8_t)iVar41;
                  }
                  ptr_00[uVar37] = iVar35;
                  iVar41 = iVar41 - gap;
                }
                alVar7 = (__m256i)vpsubsb_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar51);
                iVar41 = (int)size;
                for (uVar34 = iVar41 - 1U; -1 < (int)uVar34; uVar34 = uVar34 - 1) {
                  ptr_03[uVar34] = alVar7;
                  alVar7 = (__m256i)vpsubsb_avx2((undefined1  [32])alVar7,auVar52);
                }
                lVar36 = size * 0x20;
                auVar49 = ZEXT3264(auVar47);
                auVar50 = ZEXT3264(auVar46);
                uVar37 = 0;
                while (uVar37 != (uint)s2Len) {
                  auVar53 = SUB3216(ptr_02[iVar41 - 1U],0);
                  auVar54._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar45;
                  auVar54._16_16_ = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar53;
                  auVar54 = vpalignr_avx2((undefined1  [32])ptr_02[iVar41 - 1U],auVar54,0xf);
                  auVar53 = vpinsrb_avx(auVar54._0_16_,(uint)(byte)ptr_00[uVar37],0);
                  auVar54 = vpblendd_avx2(auVar54,ZEXT1632(auVar53),0xf);
                  iVar38 = ppVar4->mapper[(byte)s2[uVar37]];
                  auVar8 = vpsubsb_avx2(auVar46,(undefined1  [32])*ptr_03);
                  auVar6 = auVar46;
                  for (lVar39 = 0; lVar36 != lVar39; lVar39 = lVar39 + 0x20) {
                    auVar55 = vpaddsb_avx2(auVar54,*(undefined1 (*) [32])
                                                    ((long)pvVar3 +
                                                    lVar39 + (long)(iVar38 * iVar41) * 0x20));
                    auVar54 = *(undefined1 (*) [32])((long)*ptr_02 + lVar39);
                    auVar9 = vpsubsb_avx2(*(undefined1 (*) [32])((long)*ptr + lVar39),auVar52);
                    auVar10 = vpsubsb_avx2(auVar54,auVar51);
                    auVar8 = vpaddsb_avx2(auVar8,*(undefined1 (*) [32])((long)*ptr_03 + lVar39));
                    auVar9 = vpmaxsb_avx2(auVar9,auVar10);
                    auVar6 = vpmaxsb_avx2(auVar6,auVar8);
                    *(undefined1 (*) [32])((long)*ptr + lVar39) = auVar9;
                    auVar8 = vpmaxsb_avx2(auVar9,auVar55);
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar39) = auVar8;
                  }
                  auVar55._0_16_ = ZEXT116(0) * auVar8._0_16_ + ZEXT116(1) * auVar45;
                  auVar55._16_16_ = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar8._0_16_;
                  auVar54 = vpalignr_avx2(auVar8,auVar55,0xf);
                  auVar53 = vpinsrb_avx(auVar54._0_16_,(uint)(byte)ptr_00[uVar37 + 1],0);
                  auVar8 = vpblendd_avx2(auVar54,ZEXT1632(auVar53),0xf);
                  auVar54 = vpaddsb_avx2(auVar8,(undefined1  [32])*ptr_03);
                  auVar54 = vpmaxsb_avx2(auVar6,auVar54);
                  iVar38 = 0x1e;
                  while( true ) {
                    auVar6 = vperm2i128_avx2(auVar54,auVar54,8);
                    auVar6 = vpalignr_avx2(auVar54,auVar6,0xf);
                    bVar42 = iVar38 == 0;
                    iVar38 = iVar38 + -1;
                    if (bVar42) break;
                    auVar6 = vpaddsb_avx2(auVar6,auVar48);
                    auVar54 = vpmaxsb_avx2(auVar54,auVar6);
                  }
                  auVar54 = vpaddsb_avx2(auVar6,ZEXT132(bVar28));
                  auVar6 = vpmaxsb_avx2(auVar8,auVar54);
                  for (lVar39 = 0; lVar36 != lVar39; lVar39 = lVar39 + 0x20) {
                    auVar54 = vpsubsb_avx2(auVar54,auVar52);
                    auVar6 = vpsubsb_avx2(auVar6,auVar51);
                    auVar54 = vpmaxsb_avx2(auVar54,auVar6);
                    auVar6 = vpmaxsb_avx2(auVar54,*(undefined1 (*) [32])((long)*ptr_01 + lVar39));
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar39) = auVar6;
                    auVar8 = vpminsb_avx2(auVar49._0_32_,auVar6);
                    auVar49 = ZEXT3264(auVar8);
                    auVar8 = vpmaxsb_avx2(auVar50._0_32_,auVar6);
                    auVar50 = ZEXT3264(auVar8);
                  }
                  alVar7 = ptr_02[(ulong)uVar26 % size];
                  for (iVar38 = 0; iVar38 < iVar31; iVar38 = iVar38 + 1) {
                    auVar54 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,0x28
                                             );
                    alVar7 = (__m256i)vpalignr_avx2((undefined1  [32])alVar7,auVar54,0xf);
                  }
                  ((ppVar27->field_4).rowcols)->score_row[uVar37] = (int)alVar7[2]._7_1_;
                  uVar37 = uVar37 + 1;
                }
                for (uVar37 = 0; (uint)(iVar41 * 4) != uVar37; uVar37 = uVar37 + 4) {
                  piVar5 = ((ppVar27->field_4).rowcols)->score_col;
                  plVar2 = *ptr_02 + uVar37;
                  lVar23 = *plVar2;
                  cVar25 = *(char *)((long)plVar2 + 1);
                  cVar44 = *(char *)((long)plVar2 + 2);
                  cVar11 = *(char *)((long)plVar2 + 3);
                  cVar12 = *(char *)((long)plVar2 + 4);
                  cVar13 = *(char *)((long)plVar2 + 5);
                  cVar14 = *(char *)((long)plVar2 + 6);
                  cVar15 = *(char *)((long)plVar2 + 7);
                  plVar2 = *ptr_02 + uVar37 + 2;
                  lVar24 = *plVar2;
                  cVar16 = *(char *)((long)plVar2 + 1);
                  cVar17 = *(char *)((long)plVar2 + 2);
                  cVar18 = *(char *)((long)plVar2 + 3);
                  cVar19 = *(char *)((long)plVar2 + 4);
                  cVar20 = *(char *)((long)plVar2 + 5);
                  cVar21 = *(char *)((long)plVar2 + 6);
                  cVar22 = *(char *)((long)plVar2 + 7);
                  *(int *)((long)piVar5 + uVar37) = (int)(char)lVar23;
                  *(int *)((long)piVar5 + (uint)(iVar41 * 4) + uVar37) = (int)cVar25;
                  *(int *)((long)piVar5 + (uint)(iVar41 * 8) + uVar37) = (int)cVar44;
                  *(int *)((long)piVar5 + size * 0xc + uVar37) = (int)cVar11;
                  *(int *)((long)piVar5 + (uint)(iVar41 << 4) + uVar37) = (int)cVar12;
                  *(int *)((long)piVar5 + size * 0x14 + uVar37) = (int)cVar13;
                  *(int *)((long)piVar5 + size * 0x18 + uVar37) = (int)cVar14;
                  *(int *)((long)piVar5 + size * 0x1c + uVar37) = (int)cVar15;
                  *(int *)((long)piVar5 + lVar36 + uVar37) = (int)(char)lVar23;
                  *(int *)((long)piVar5 + size * 0x24 + uVar37) = (int)cVar25;
                  *(int *)((long)piVar5 + size * 0x28 + uVar37) = (int)cVar44;
                  *(int *)((long)piVar5 + size * 0x2c + uVar37) = (int)cVar11;
                  *(int *)((long)piVar5 + size * 0x30 + uVar37) = (int)cVar12;
                  *(int *)((long)piVar5 + size * 0x34 + uVar37) = (int)cVar13;
                  *(int *)((long)piVar5 + size * 0x38 + uVar37) = (int)cVar14;
                  *(int *)((long)piVar5 + size * 0x3c + uVar37) = (int)cVar15;
                  *(int *)((long)piVar5 + size * 0x40 + uVar37) = (int)(char)lVar24;
                  *(int *)((long)piVar5 + size * 0x44 + uVar37) = (int)cVar16;
                  *(int *)((long)piVar5 + size * 0x48 + uVar37) = (int)cVar17;
                  *(int *)((long)piVar5 + size * 0x4c + uVar37) = (int)cVar18;
                  *(int *)((long)piVar5 + size * 0x50 + uVar37) = (int)cVar19;
                  *(int *)((long)piVar5 + size * 0x54 + uVar37) = (int)cVar20;
                  *(int *)((long)piVar5 + size * 0x58 + uVar37) = (int)cVar21;
                  *(int *)((long)piVar5 + size * 0x5c + uVar37) = (int)cVar22;
                  *(int *)((long)piVar5 + size * 0x60 + uVar37) = (int)(char)lVar24;
                  *(int *)((long)piVar5 + size * 100 + uVar37) = (int)cVar16;
                  *(int *)((long)piVar5 + size * 0x68 + uVar37) = (int)cVar17;
                  *(int *)((long)piVar5 + size * 0x6c + uVar37) = (int)cVar18;
                  *(int *)((long)piVar5 + size * 0x70 + uVar37) = (int)cVar19;
                  *(int *)((long)piVar5 + size * 0x74 + uVar37) = (int)cVar20;
                  *(int *)((long)piVar5 + size * 0x78 + uVar37) = (int)cVar21;
                  *(int *)((long)piVar5 + size * 0x7c + uVar37) = (int)cVar22;
                }
                alVar7 = ptr_02[(ulong)uVar26 % size];
                for (iVar41 = 0; iVar41 < iVar31; iVar41 = iVar41 + 1) {
                  auVar48 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,0x28);
                  alVar7 = (__m256i)vpalignr_avx2((undefined1  [32])alVar7,auVar48,0xf);
                }
                auVar48 = vpcmpgtb_avx2(auVar46,auVar49._0_32_);
                auVar46 = vpcmpgtb_avx2(auVar50._0_32_,auVar47);
                auVar48 = vpor_avx2(auVar46,auVar48);
                if ((((((((((((((((((((((((((((((((auVar48 >> 7 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0 &&
                                                 (auVar48 >> 0xf & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar48 >> 0x17 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar48 >> 0x1f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar48 >> 0x27 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar48 >> 0x2f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar48 >> 0x37 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar48 >> 0x3f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar48 >> 0x47 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar48 >> 0x4f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar48 >> 0x57 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar48 >> 0x5f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar48 >> 0x67 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar48 >> 0x6f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar48 >> 0x77 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar48 >> 0x7f,0) == '\0') &&
                                  (auVar48 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar48 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar48 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar48 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar48 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar48 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar48 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar48 >> 0xbf,0) == '\0') &&
                          (auVar48 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar48 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar48 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar48 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar48 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar48 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar48 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    -1 < auVar48[0x1f]) {
                  cVar25 = alVar7[2]._7_1_;
                }
                else {
                  *(byte *)&ppVar27->flag = (byte)ppVar27->flag | 0x40;
                  cVar25 = '\0';
                  iVar29 = 0;
                  uVar26 = 0;
                }
                ppVar27->score = (int)cVar25;
                ppVar27->end_query = uVar26;
                ppVar27->end_ref = iVar29;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar27;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar30 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_rowcol_scan_profile_avx2_256_8",pcVar30);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m256i vZero;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi8(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_subs_epi8(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi8(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 1);
        vHp = _mm256_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi8(
                    _mm256_subs_epi8(vE, vGapE),
                    _mm256_subs_epi8(vH, vGapO));
            vHp = _mm256_adds_epi8(vHp, vW);
            vF = _mm256_max_epi8(vF, _mm256_adds_epi8(vHt, pvGapper[i]));
            vHt = _mm256_max_epi8(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 1);
        vHt = _mm256_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi8(vF, _mm256_adds_epi8(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 1);
            vFt = _mm256_adds_epi8(vFt, vSegLenXgap);
            vF = _mm256_max_epi8(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 1);
        vF = _mm256_adds_epi8(vF, vNegInfFront);
        vH = _mm256_max_epi8(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi8(
                    _mm256_subs_epi8(vF, vGapE),
                    _mm256_subs_epi8(vH, vGapO));
            vH = _mm256_max_epi8(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}